

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureUnitTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::MultiTexShader::MultiTexShader
          (MultiTexShader *this,deUint32 randSeed,int numUnits,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *unitTypes)

{
  int iVar1;
  const_reference unitTypes_00;
  reference pvVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  value_type local_53c;
  Matrix<float,_3,_3> local_52c;
  undefined1 local_508 [8];
  Mat3 finalTrans;
  Mat3 planarTrans;
  int faceNdx;
  int i;
  float planarTransData [9];
  Matrix<float,_3,_3> local_480;
  Matrix<float,_3,_3> local_45c;
  Matrix<float,_3,_3> local_438;
  Matrix<float,_3,_3> local_414;
  Matrix<float,_3,_3> local_3f0;
  Matrix<float,_3,_3> local_3cc;
  Matrix<float,_3,_3> local_3a8;
  Matrix<float,_3,_3> local_384;
  Matrix<float,_3,_3> local_360;
  Matrix<float,_3,_3> local_33c;
  Matrix<float,_3,_3> local_318;
  Matrix<float,_3,_3> local_2f4;
  Matrix<float,_3,_3> local_2d0;
  undefined1 local_2ac [8];
  Mat3 transformation;
  float translationTransfData [9];
  float local_258 [2];
  float yShearTransfData [9];
  float local_228;
  float local_224;
  float xShearTransfData [9];
  float local_1f8 [2];
  float scaleTransfData [9];
  float local_1c8;
  float local_1c4;
  float rotTransfData [9];
  float afStack_198 [2];
  float tempOffsetData [9];
  float yTranslationAmount;
  float xTranslationAmount;
  float yShearAmount;
  float xShearAmount;
  float yScaleFactor;
  float xScaleFactor;
  float rotAngle;
  int unitNdx;
  Random rnd;
  ShaderProgramDeclaration local_130;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_20;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *unitTypes_local;
  int numUnits_local;
  deUint32 randSeed_local;
  MultiTexShader *this_local;
  
  local_20 = unitTypes;
  unitTypes_local._0_4_ = numUnits;
  unitTypes_local._4_4_ = randSeed;
  _numUnits_local = this;
  unitTypes_00 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](unitTypes,0);
  generateShaderProgramDeclaration(&local_130,numUnits,unitTypes_00);
  sglr::ShaderProgram::ShaderProgram(&this->super_ShaderProgram,&local_130);
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_130);
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_0327b948;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_0327b980;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_0327b998;
  *(int *)&(this->super_ShaderProgram).field_0x154 = (int)unitTypes_local;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_unitTypes,local_20);
  std::vector<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>::vector
            (&this->m_transformations);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&this->m_lodDerivateParts);
  de::Random::Random((Random *)&rotAngle,unitTypes_local._4_4_);
  std::vector<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>::reserve
            (&this->m_transformations,(long)*(int *)&(this->super_ShaderProgram).field_0x154);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::reserve
            (&this->m_lodDerivateParts,(long)*(int *)&(this->super_ShaderProgram).field_0x154);
  for (xScaleFactor = 0.0; (int)xScaleFactor < *(int *)&(this->super_ShaderProgram).field_0x154;
      xScaleFactor = (float)((int)xScaleFactor + 1)) {
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_unitTypes,(long)(int)xScaleFactor);
    if (*pvVar2 == 0xde1) {
      fVar3 = de::Random::getFloat((Random *)&rotAngle,0.0,6.2831855);
      fVar4 = de::Random::getFloat((Random *)&rotAngle,0.7,1.5);
      fVar5 = de::Random::getFloat((Random *)&rotAngle,0.7,1.5);
      fVar6 = de::Random::getFloat((Random *)&rotAngle,0.0,0.5);
      fVar7 = de::Random::getFloat((Random *)&rotAngle,0.0,0.5);
      de::Random::getFloat((Random *)&rotAngle,-0.5,0.5);
      de::Random::getFloat((Random *)&rotAngle,-0.5,0.5);
      tempOffsetData[4] = 0.0;
      tempOffsetData[5] = 0.0;
      afStack_198[0] = 1.0;
      afStack_198[1] = 0.0;
      tempOffsetData[0] = -0.5;
      tempOffsetData[1] = 0.0;
      tempOffsetData[2] = 1.0;
      tempOffsetData[3] = -0.5;
      tempOffsetData[6] = 1.0;
      local_1c8 = ::deFloatCos(fVar3);
      local_1c4 = ::deFloatSin(fVar3);
      local_1c4 = -local_1c4;
      rotTransfData[0] = 0.0;
      rotTransfData[1] = ::deFloatSin(fVar3);
      rotTransfData[2] = ::deFloatCos(fVar3);
      rotTransfData[3] = 0.0;
      rotTransfData[4] = 0.0;
      rotTransfData[5] = 0.0;
      rotTransfData[6] = 1.0;
      local_1f8[1] = 0.0;
      scaleTransfData[0] = 0.0;
      scaleTransfData[1] = 0.0;
      scaleTransfData[3] = 0.0;
      scaleTransfData[4] = 0.0;
      scaleTransfData[5] = 0.0;
      scaleTransfData[6] = 1.0;
      local_228 = 1.0;
      xShearTransfData[0] = 0.0;
      xShearTransfData[1] = 0.0;
      xShearTransfData[2] = 1.0;
      xShearTransfData[3] = 0.0;
      xShearTransfData[4] = 0.0;
      xShearTransfData[5] = 0.0;
      xShearTransfData[6] = 1.0;
      local_258[0] = 1.0;
      local_258[1] = 0.0;
      yShearTransfData[0] = 0.0;
      yShearTransfData[2] = 1.0;
      yShearTransfData[3] = 0.0;
      yShearTransfData[4] = 0.0;
      yShearTransfData[5] = 0.0;
      yShearTransfData[6] = 1.0;
      transformation.m_data.m_data[2].m_data[1] = 1.0;
      transformation.m_data.m_data[2].m_data[2] = 0.0;
      yShearTransfData[1] = fVar7;
      local_224 = fVar6;
      local_1f8[0] = fVar4;
      scaleTransfData[2] = fVar5;
      tcu::Matrix<float,_3,_3>::Matrix(&local_384,afStack_198);
      tcu::Matrix<float,_3,_3>::Matrix(&local_3a8,transformation.m_data.m_data[2].m_data + 1);
      tcu::operator*(&local_360,&local_384,&local_3a8);
      tcu::Matrix<float,_3,_3>::Matrix(&local_3cc,&local_1c8);
      tcu::operator*(&local_33c,&local_360,&local_3cc);
      tcu::Matrix<float,_3,_3>::Matrix(&local_3f0,local_1f8);
      tcu::operator*(&local_318,&local_33c,&local_3f0);
      tcu::Matrix<float,_3,_3>::Matrix(&local_414,&local_228);
      tcu::operator*(&local_2f4,&local_318,&local_414);
      tcu::Matrix<float,_3,_3>::Matrix(&local_438,local_258);
      tcu::operator*(&local_2d0,&local_2f4,&local_438);
      tcu::Matrix<float,_3,_3>::Matrix(&local_480,afStack_198);
      tcu::operator*(&local_45c,&local_480,-1.0);
      tcu::operator*((Matrix<float,_3,_3> *)local_2ac,&local_2d0,&local_45c);
      tcu::Matrix<float,_3,_3>::~Matrix(&local_45c);
      tcu::Matrix<float,_3,_3>::~Matrix(&local_480);
      tcu::Matrix<float,_3,_3>::~Matrix(&local_2d0);
      tcu::Matrix<float,_3,_3>::~Matrix(&local_438);
      tcu::Matrix<float,_3,_3>::~Matrix(&local_2f4);
      tcu::Matrix<float,_3,_3>::~Matrix(&local_414);
      tcu::Matrix<float,_3,_3>::~Matrix(&local_318);
      tcu::Matrix<float,_3,_3>::~Matrix(&local_3f0);
      tcu::Matrix<float,_3,_3>::~Matrix(&local_33c);
      tcu::Matrix<float,_3,_3>::~Matrix(&local_3cc);
      tcu::Matrix<float,_3,_3>::~Matrix(&local_360);
      tcu::Matrix<float,_3,_3>::~Matrix(&local_3a8);
      tcu::Matrix<float,_3,_3>::~Matrix(&local_384);
      calculateLodDerivateParts((Functional *)(planarTransData + 8),(Mat3 *)local_2ac);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                (&this->m_lodDerivateParts,(value_type *)(planarTransData + 8));
      std::vector<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>::push_back
                (&this->m_transformations,(value_type *)local_2ac);
      tcu::Matrix<float,_3,_3>::~Matrix((Matrix<float,_3,_3> *)local_2ac);
    }
    else {
      for (planarTrans.m_data.m_data[2].m_data[2] = 0.0;
          (int)planarTrans.m_data.m_data[2].m_data[2] < 9;
          planarTrans.m_data.m_data[2].m_data[2] =
               (float)((int)planarTrans.m_data.m_data[2].m_data[2] + 1)) {
        if ((planarTrans.m_data.m_data[2].m_data[2] == 0.0) ||
           (planarTrans.m_data.m_data[2].m_data[2] == 5.60519e-45)) {
          fVar3 = de::Random::getFloat((Random *)&rotAngle,0.1,0.9);
          (&faceNdx)[(int)planarTrans.m_data.m_data[2].m_data[2]] = (int)fVar3;
        }
        else if (planarTrans.m_data.m_data[2].m_data[2] == 1.12104e-44) {
          planarTransData[6] = 1.0;
        }
        else {
          (&faceNdx)[(int)planarTrans.m_data.m_data[2].m_data[2]] = 0;
        }
      }
      iVar1 = de::Random::getInt((Random *)&rotAngle,0,5);
      tcu::Matrix<float,_3,_3>::Matrix
                ((Matrix<float,_3,_3> *)(finalTrans.m_data.m_data[2].m_data + 1),(float *)&faceNdx);
      tcu::Matrix<float,_3,_3>::Matrix(&local_52c,MultiTexShader::s_cubeTransforms[iVar1]);
      tcu::operator*((Matrix<float,_3,_3> *)local_508,&local_52c,
                     (Matrix<float,_3,_3> *)(finalTrans.m_data.m_data[2].m_data + 1));
      tcu::Matrix<float,_3,_3>::~Matrix(&local_52c);
      calculateLodDerivateParts
                ((Functional *)&local_53c,(Mat3 *)(finalTrans.m_data.m_data[2].m_data + 1));
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                (&this->m_lodDerivateParts,&local_53c);
      std::vector<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>::push_back
                (&this->m_transformations,(value_type *)local_508);
      tcu::Matrix<float,_3,_3>::~Matrix((Matrix<float,_3,_3> *)local_508);
      tcu::Matrix<float,_3,_3>::~Matrix
                ((Matrix<float,_3,_3> *)(finalTrans.m_data.m_data[2].m_data + 1));
    }
  }
  de::Random::~Random((Random *)&rotAngle);
  return;
}

Assistant:

MultiTexShader::MultiTexShader (deUint32 randSeed, int numUnits, const vector<GLenum>& unitTypes)
	: sglr::ShaderProgram	(generateShaderProgramDeclaration(numUnits, &unitTypes[0]))
	, m_numUnits			(numUnits)
	, m_unitTypes			(unitTypes)
{
	// 2d-to-cube-face transformations.
	// \note 2d coordinates range from 0 to 1 and cube face coordinates from -1 to 1, so scaling is done as well.
	static const float s_cubeTransforms[][3*3] =
	{
		// Face -X: (x, y, 1) -> (-1, -(2*y-1), +(2*x-1))
		{  0.0f,  0.0f, -1.0f,
		   0.0f, -2.0f,  1.0f,
		   2.0f,  0.0f, -1.0f },
		// Face +X: (x, y, 1) -> (+1, -(2*y-1), -(2*x-1))
		{  0.0f,  0.0f,  1.0f,
		   0.0f, -2.0f,  1.0f,
		  -2.0f,  0.0f,  1.0f },
		// Face -Y: (x, y, 1) -> (+(2*x-1), -1, -(2*y-1))
		{  2.0f,  0.0f, -1.0f,
		   0.0f,  0.0f, -1.0f,
		   0.0f, -2.0f,  1.0f },
		// Face +Y: (x, y, 1) -> (+(2*x-1), +1, +(2*y-1))
		{  2.0f,  0.0f, -1.0f,
		   0.0f,  0.0f,  1.0f,
		   0.0f,  2.0f, -1.0f },
		// Face -Z: (x, y, 1) -> (-(2*x-1), -(2*y-1), -1)
		{ -2.0f,  0.0f,  1.0f,
		   0.0f, -2.0f,  1.0f,
		   0.0f,  0.0f, -1.0f },
		// Face +Z: (x, y, 1) -> (+(2*x-1), -(2*y-1), +1)
		{  2.0f,  0.0f, -1.0f,
		   0.0f, -2.0f,  1.0f,
		   0.0f,  0.0f,  1.0f }
	};

	// Generate transformation matrices.

	de::Random rnd(randSeed);

	m_transformations.reserve(m_numUnits);
	m_lodDerivateParts.reserve(m_numUnits);

	DE_ASSERT((int)m_unitTypes.size() == m_numUnits);

	for (int unitNdx = 0; unitNdx < m_numUnits; unitNdx++)
	{
		if (m_unitTypes[unitNdx] == GL_TEXTURE_2D)
		{
			float rotAngle				= rnd.getFloat(0.0f, 2.0f*DE_PI);
			float xScaleFactor			= rnd.getFloat(0.7f, 1.5f);
			float yScaleFactor			= rnd.getFloat(0.7f, 1.5f);
			float xShearAmount			= rnd.getFloat(0.0f, 0.5f);
			float yShearAmount			= rnd.getFloat(0.0f, 0.5f);
			float xTranslationAmount	= rnd.getFloat(-0.5f, 0.5f);
			float yTranslationAmount	= rnd.getFloat(-0.5f, 0.5f);

			float tempOffsetData[3*3] = // For temporarily centering the coordinates to get nicer transformations.
			{
				1.0f,  0.0f, -0.5f,
				0.0f,  1.0f, -0.5f,
				0.0f,  0.0f,  1.0f
			};
			float rotTransfData[3*3] =
			{
				deFloatCos(rotAngle),	-deFloatSin(rotAngle),	0.0f,
				deFloatSin(rotAngle),	deFloatCos(rotAngle),	0.0f,
				0.0f,					0.0f,					1.0f
			};
			float scaleTransfData[3*3] =
			{
				xScaleFactor,	0.0f,			0.0f,
				0.0f,			yScaleFactor,	0.0f,
				0.0f,			0.0f,			1.0f
			};
			float xShearTransfData[3*3] =
			{
				1.0f,			xShearAmount,	0.0f,
				0.0f,			1.0f,			0.0f,
				0.0f,			0.0f,			1.0f
			};
			float yShearTransfData[3*3] =
			{
				1.0f,			0.0f,			0.0f,
				yShearAmount,	1.0f,			0.0f,
				0.0f,			0.0f,			1.0f
			};
			float translationTransfData[3*3] =
			{
				1.0f,	0.0f,	xTranslationAmount,
				0.0f,	1.0f,	yTranslationAmount,
				0.0f,	0.0f,	1.0f
			};

			Mat3 transformation =
				Mat3(tempOffsetData) *
				Mat3(translationTransfData) *
				Mat3(rotTransfData) *
				Mat3(scaleTransfData) *
				Mat3(xShearTransfData) *
				Mat3(yShearTransfData) *
				(Mat3(tempOffsetData) * (-1.0f));

			// Calculate parts of lod derivates.
			m_lodDerivateParts.push_back(calculateLodDerivateParts(transformation));

			m_transformations.push_back(transformation);
		}
		else
		{
			DE_ASSERT(m_unitTypes[unitNdx] == GL_TEXTURE_CUBE_MAP);
			DE_STATIC_ASSERT((int)tcu::CUBEFACE_LAST == DE_LENGTH_OF_ARRAY(s_cubeTransforms));

			float planarTransData[3*3];

			// In case of a cube map, we only want to render one face, so the transformation needs to be restricted - only enlarging scaling is done.

			for (int i = 0; i < DE_LENGTH_OF_ARRAY(planarTransData); i++)
			{
				if (i == 0 || i == 4)
					planarTransData[i] = rnd.getFloat(0.1f, 0.9f); // Two first diagonal cells control the scaling.
				else if (i == 8)
					planarTransData[i] = 1.0f;
				else
					planarTransData[i] = 0.0f;
			}

			int		faceNdx			= rnd.getInt(0, (int)tcu::CUBEFACE_LAST - 1);
			Mat3	planarTrans		(planarTransData);									// Planar, face-agnostic transformation.
			Mat3	finalTrans		= Mat3(s_cubeTransforms[faceNdx]) * planarTrans;	// Final transformation from planar to cube map coordinates, including the transformation just generated.

			// Calculate parts of lod derivates.
			m_lodDerivateParts.push_back(calculateLodDerivateParts(planarTrans));

			m_transformations.push_back(finalTrans);
		}
	}
}